

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O1

int Dau_DecVerify(word *pInit,int nVars,char *pDsdC,char *pDsdD)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  word *pwVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  word pC [8192];
  word pRes [8192];
  word pD [8192];
  ulong auStack_30028 [8192];
  ulong auStack_20028 [8192];
  ulong auStack_10028 [8192];
  
  bVar2 = (byte)nVars;
  uVar13 = 1 << (bVar2 - 5 & 0x1f);
  if (nVars < 6) {
    uVar13 = 1;
  }
  uVar1 = 1 << (bVar2 - 6 & 0x1f);
  if (nVars < 7) {
    uVar1 = 1;
  }
  if (0xf < nVars) {
    __assert_fail("nVars < 16",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                  ,0x2b4,"int Dau_DecVerify(word *, int, char *, char *)");
  }
  pwVar4 = Dau_DsdToTruth(pDsdC,nVars + 1);
  memcpy(auStack_30028,pwVar4,(long)(int)uVar13 << 3);
  pwVar4 = Dau_DsdToTruth(pDsdD,nVars);
  memcpy(auStack_10028,pwVar4,(long)(int)uVar1 * 8);
  if (nVars < 6) {
    if (nVars < 0) {
      __assert_fail("nVars >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x489,"word Abc_Tt6Stretch(word, int)");
    }
    iVar5 = 1;
    if (1U < (uint)nVars) {
      iVar5 = nVars;
    }
    iVar11 = 2;
    if (1U < (uint)nVars) {
      iVar11 = iVar5;
    }
    iVar5 = 3;
    if (iVar11 != 2) {
      iVar5 = iVar11;
    }
    iVar10 = 4;
    if (iVar5 != 3) {
      iVar10 = iVar5;
    }
    iVar8 = 5;
    if (iVar10 != 4) {
      iVar8 = iVar10;
    }
    if (1 < iVar8 - 5U) {
      __assert_fail("nVars == 6",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                    ,0x496,"word Abc_Tt6Stretch(word, int)");
    }
    uVar9 = auStack_30028[0] >> ((byte)(1 << (bVar2 & 0x1f)) & 0x3f);
    uVar14 = (uint)uVar9;
    uVar13 = ((uint)auStack_30028[0] & 1) * 3;
    if (nVars != 0) {
      uVar13 = (uint)auStack_30028[0];
    }
    uVar3 = (uVar14 & 1) * 3;
    if (nVars != 0) {
      uVar3 = uVar14;
    }
    uVar6 = (ulong)(uVar13 & 3) * 5;
    if (1U < (uint)nVars) {
      uVar6 = auStack_30028[0];
    }
    uVar12 = (ulong)(uVar3 & 3) * 5;
    if (1U < (uint)nVars) {
      uVar12 = uVar9;
    }
    uVar13 = (uint)uVar6 & 0xf;
    uVar14 = (uint)uVar12 & 0xf;
    uVar7 = (ulong)(uVar14 << 4 | uVar14);
    uVar9 = (ulong)(uVar13 << 4 | uVar13);
    if (iVar11 != 2) {
      uVar7 = uVar12;
      uVar9 = uVar6;
    }
    uVar12 = (ulong)(uint)((int)(uVar7 & 0xff) << 8) | uVar7 & 0xff;
    uVar6 = (ulong)(uint)((int)(uVar9 & 0xff) << 8) | uVar9 & 0xff;
    if (iVar5 != 3) {
      uVar12 = uVar7;
      uVar6 = uVar9;
    }
    uVar9 = (ulong)(uint)((int)uVar6 << 0x10) | uVar6 & 0xffff;
    if (iVar10 != 4) {
      uVar9 = uVar6;
    }
    uVar6 = (ulong)(uint)((int)uVar12 << 0x10) | uVar12 & 0xffff;
    if (iVar10 != 4) {
      uVar6 = uVar12;
    }
    uVar7 = uVar6 << 0x20 | uVar6 & 0xffffffff;
    uVar12 = uVar9 << 0x20 | uVar9 & 0xffffffff;
    if (iVar8 != 5) {
      uVar7 = uVar6;
      uVar12 = uVar9;
    }
    if (0 < (int)uVar1) {
      uVar9 = 0;
      do {
        auStack_20028[uVar9] = auStack_10028[uVar9] & (uVar7 ^ uVar12) ^ uVar12;
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
  }
  else {
    if ((int)uVar1 < 1) {
      __assert_fail("nWordsD >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                    ,0x2b9,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    if ((int)uVar13 < 2) {
      __assert_fail("nWordsC > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNonDsd.c"
                    ,0x2ba,"int Dau_DecVerify(word *, int, char *, char *)");
    }
    uVar9 = 0;
    do {
      auStack_20028[uVar9] =
           (auStack_30028[(long)(int)uVar1 + uVar9] ^ auStack_30028[uVar9]) & auStack_10028[uVar9] ^
           auStack_30028[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  if (0 < (int)uVar1) {
    uVar9 = 0;
    do {
      if (pInit[uVar9] != auStack_20028[uVar9]) {
        printf("      Verification failed");
        break;
      }
      uVar9 = uVar9 + 1;
    } while (uVar1 != uVar9);
  }
  putchar(10);
  return 1;
}

Assistant:

int Dau_DecVerify( word * pInit, int nVars, char * pDsdC, char * pDsdD )
{
    word pC[1<<13], pD[1<<13], pRes[1<<13]; // max = 16
    int nWordsC = Abc_TtWordNum(nVars+1);
    int nWordsD = Abc_TtWordNum(nVars);
    assert( nVars < 16 );
    memcpy( pC, Dau_DsdToTruth(pDsdC, nVars+1), sizeof(word) * nWordsC );
    memcpy( pD, Dau_DsdToTruth(pDsdD, nVars), sizeof(word) * nWordsD );
    if ( nVars >= 6 )
    {
        assert( nWordsD >= 1 );
        assert( nWordsC > 1 );
        Abc_TtMux( pRes, pD, pC + nWordsD, pC, nWordsD );
    }
    else
    {
        word pC0 = Abc_Tt6Stretch( pC[0], nVars );
        word pC1 = Abc_Tt6Stretch( (pC[0] >> (1 << nVars)), nVars );
        Abc_TtMux( pRes, pD, &pC1, &pC0, nWordsD );
    }
    if ( !Abc_TtEqual(pInit, pRes, nWordsD) )
        printf( "      Verification failed" );
//    else
//        printf( "      Verification successful" );
    printf( "\n" );
    return 1;
}